

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Maybe<kj::Own<kj::AppendableFile,_std::nullptr_t>_> __thiscall
kj::anon_unknown_9::DiskDirectory::tryAppendFile(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  AppendableFile *extraout_RDX;
  bool in_R8B;
  Maybe<kj::Own<kj::AppendableFile,_std::nullptr_t>_> MVar1;
  PathPtr path_00;
  NullableValue<kj::OwnFd> NStack_18;
  
  path_00.parts.size_ = path.parts.size_;
  path_00.parts.ptr = &((path.parts.ptr)->content).size_;
  DiskHandle::tryOpenFileInternal((DiskHandle *)&NStack_18,path_00,mode,in_R8B);
  Maybe<kj::OwnFd>::map<kj::Own<kj::AppendableFile,_std::nullptr_t>_(&)(kj::OwnFd)>
            ((Maybe<kj::OwnFd> *)this,
             (_func_Own<kj::AppendableFile,_std::nullptr_t>_OwnFd *)&NStack_18);
  kj::_::NullableValue<kj::OwnFd>::~NullableValue(&NStack_18);
  MVar1.ptr.ptr = extraout_RDX;
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::AppendableFile,_std::nullptr_t>_>)MVar1.ptr;
}

Assistant:

Maybe<Own<AppendableFile>> tryAppendFile(PathPtr path, WriteMode mode) const override {
    return DiskHandle::tryAppendFile(path, mode);
  }